

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  GetterXsYs<unsigned_int> *pGVar4;
  GetterXsYs<unsigned_int> *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  undefined1 auVar8 [12];
  int iVar9;
  long lVar10;
  ImDrawIdx IVar11;
  ushort uVar12;
  ImPlotContext *gp;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ImVec2 IVar19;
  double dVar20;
  ImVec2 IVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar37 [16];
  
  pGVar4 = this->Getter1;
  pGVar5 = this->Getter2;
  iVar9 = pGVar4->Count;
  lVar13 = (long)(((pGVar4->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar4->Stride;
  iVar9 = this->Transformer->YAxis;
  iVar3 = pGVar5->Count;
  IVar19 = GImPlot->PixelRange[iVar9].Min;
  dVar20 = (double)IVar19.x;
  dVar22 = (double)IVar19.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar9].Range.Min;
  lVar10 = (long)(((prim + 1 + pGVar5->Offset) % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride;
  auVar30._4_4_ = 0;
  auVar30._0_4_ = *(uint *)((long)pGVar4->Xs + lVar13);
  auVar30._8_4_ = *(uint *)((long)pGVar4->Ys + lVar13);
  auVar30._12_4_ = 0;
  IVar19.x = (float)(((SUB168(auVar30 | _DAT_0036a320,0) - (double)DAT_0036a320) - dVar1) *
                     GImPlot->Mx + dVar20);
  IVar19.y = (float)(((SUB168(auVar30 | _DAT_0036a320,8) - DAT_0036a320._8_8_) - dVar2) *
                     GImPlot->My[iVar9] + dVar22);
  auVar32._4_4_ = 0;
  auVar32._0_4_ = *(uint *)((long)pGVar5->Xs + lVar10);
  auVar32._8_4_ = *(uint *)((long)pGVar5->Ys + lVar10);
  auVar32._12_4_ = 0;
  IVar21.x = (float)(((SUB168(auVar32 | _DAT_0036a320,0) - (double)DAT_0036a320) - dVar1) *
                     GImPlot->Mx + dVar20);
  IVar21.y = (float)(((SUB168(auVar32 | _DAT_0036a320,8) - DAT_0036a320._8_8_) - dVar2) *
                     GImPlot->My[iVar9] + dVar22);
  fVar23 = (this->P12).x;
  fVar24 = (this->P12).y;
  fVar26 = (this->P11).x;
  fVar27 = (this->P11).y;
  uVar17 = -(uint)(fVar27 < fVar24);
  fVar25 = (float)(~-(uint)(fVar23 <= fVar26) & (uint)fVar23 |
                  (uint)fVar26 & -(uint)(fVar23 <= fVar26));
  fVar28 = (float)(~-(uint)(fVar24 <= fVar27) & (uint)fVar24 |
                  (uint)fVar27 & -(uint)(fVar24 <= fVar27));
  fVar31 = (float)(~-(uint)(fVar26 < fVar23) & (uint)fVar23 |
                  (uint)fVar26 & -(uint)(fVar26 < fVar23));
  fVar41 = (float)(~uVar17 & (uint)fVar24 | (uint)fVar27 & uVar17);
  uVar14 = -(uint)(IVar19.x <= fVar25);
  uVar15 = -(uint)(IVar19.y <= fVar28);
  uVar16 = -(uint)(fVar31 < IVar19.x);
  uVar18 = -(uint)(fVar41 < IVar19.y);
  fVar25 = (float)(~uVar14 & (uint)IVar19.x | (uint)fVar25 & uVar14);
  fVar28 = (float)(~uVar15 & (uint)IVar19.y | (uint)fVar28 & uVar15);
  fVar31 = (float)(~uVar16 & (uint)IVar19.x | (uint)fVar31 & uVar16);
  fVar41 = (float)(~uVar18 & (uint)IVar19.y | (uint)fVar41 & uVar18);
  uVar14 = -(uint)(IVar21.x <= fVar25);
  uVar15 = -(uint)(IVar21.y <= fVar28);
  uVar16 = -(uint)(fVar31 < IVar21.x);
  uVar18 = -(uint)(fVar41 < IVar21.y);
  auVar33._0_4_ = (uint)fVar25 & uVar14;
  auVar33._4_4_ = (uint)fVar28 & uVar15;
  auVar33._8_4_ = (uint)fVar31 & uVar16;
  auVar33._12_4_ = (uint)fVar41 & uVar18;
  auVar38._0_4_ = ~uVar14 & (uint)IVar21.x;
  auVar38._4_4_ = ~uVar15 & (uint)IVar21.y;
  auVar38._8_4_ = ~uVar16 & (uint)IVar21.x;
  auVar38._12_4_ = ~uVar18 & (uint)IVar21.y;
  auVar38 = auVar38 | auVar33;
  fVar25 = (cull_rect->Min).y;
  auVar40._4_4_ = -(uint)(fVar25 < auVar38._4_4_);
  auVar40._0_4_ = -(uint)((cull_rect->Min).x < auVar38._0_4_);
  auVar8._4_8_ = auVar38._8_8_;
  auVar8._0_4_ = -(uint)(auVar38._4_4_ < fVar25);
  auVar39._0_8_ = auVar8._0_8_ << 0x20;
  auVar39._8_4_ = -(uint)(auVar38._8_4_ < (cull_rect->Max).x);
  auVar39._12_4_ = -(uint)(auVar38._12_4_ < (cull_rect->Max).y);
  auVar40._8_8_ = auVar39._8_8_;
  iVar9 = movmskps((int)lVar10,auVar40);
  if (iVar9 == 0xf) {
    fVar28 = IVar19.y * fVar26 - fVar27 * IVar19.x;
    fVar31 = IVar21.y * fVar23 - fVar24 * IVar21.x;
    fVar25 = fVar24 - IVar21.y;
    auVar34._4_4_ = fVar25;
    auVar34._0_4_ = fVar25;
    auVar34._8_4_ = fVar25;
    auVar34._12_4_ = fVar25;
    auVar35._4_12_ = auVar34._4_12_;
    auVar35._0_4_ = fVar25 * (fVar26 - IVar19.x) - (fVar27 - IVar19.y) * (fVar23 - IVar21.x);
    auVar29._0_4_ = fVar28 * (fVar23 - IVar21.x) - fVar31 * (fVar26 - IVar19.x);
    auVar29._4_4_ = fVar28 * fVar25 - fVar31 * (fVar27 - IVar19.y);
    auVar29._8_4_ = IVar19.y * 0.0 - IVar21.y * 0.0;
    auVar29._12_4_ = IVar19.y * 0.0 - IVar21.y * 0.0;
    auVar37._0_8_ = auVar35._0_8_;
    auVar37._8_4_ = fVar25;
    auVar37._12_4_ = fVar25;
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._4_4_ = auVar35._0_4_;
    auVar36._0_4_ = auVar35._0_4_;
    auVar30 = divps(auVar29,auVar36);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = this->Col;
    pIVar6[1].pos = IVar19;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = this->Col;
    pIVar6[2].pos = auVar30._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = this->Col;
    pIVar6[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = this->Col;
    pIVar6[4].pos = IVar21;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar6 + 5;
    uVar14 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar11 = (ImDrawIdx)uVar14;
    *pIVar7 = IVar11;
    uVar12 = (byte)((byte)uVar17 & IVar21.y < IVar19.y | -(fVar24 < fVar27) & -(IVar19.y < IVar21.y)
                   ) & 1;
    pIVar7[1] = IVar11 + uVar12 + 1;
    pIVar7[2] = IVar11 + 3;
    pIVar7[3] = IVar11 + 1;
    pIVar7[4] = (uVar12 ^ 3) + IVar11;
    pIVar7[5] = IVar11 + 4;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar14 + 5;
  }
  this->P11 = IVar19;
  this->P12 = IVar21;
  return (char)iVar9 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }